

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cpp
# Opt level: O1

bool __thiscall CBloomFilter::IsRelevantAndUpdate(CBloomFilter *this,CTransaction *tx)

{
  uint uVar1;
  pointer pCVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  TxoutType TVar7;
  CScript *pCVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  pointer outpoint;
  pointer pCVar12;
  CScript *pCVar13;
  CScript *pCVar14;
  uint32_t uVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  Span<const_unsigned_char> vKey_01;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  vSolutions;
  opcodetype opcode;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  const_iterator pc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_1;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_a8;
  opcodetype local_8c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  const_iterator local_70;
  undefined1 local_68 [8];
  pointer puStack_60;
  pointer local_58;
  uchar auStack_50 [8];
  uint32_t local_48;
  long local_38;
  const_iterator end;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = true;
  if ((this->vData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->vData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    vKey.m_data = &tx->hash;
    vKey.m_size = 0x20;
    bVar3 = contains(this,vKey);
    pCVar12 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_finish != pCVar12) {
      uVar16 = 0;
      do {
        pCVar14 = &pCVar12[uVar16].scriptPubKey;
        local_70.ptr = (uchar *)pCVar14;
        if (0x1c < pCVar12[uVar16].scriptPubKey.super_CScriptBase._size) {
          local_70.ptr = (uchar *)pCVar12[uVar16].scriptPubKey.super_CScriptBase._union.
                                  indirect_contents.indirect;
        }
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        do {
          uVar1 = pCVar12[uVar16].scriptPubKey.super_CScriptBase._size;
          uVar9 = uVar1 - 0x1d;
          if (uVar1 < 0x1d) {
            uVar9 = uVar1;
          }
          pCVar13 = (CScript *)(pCVar14->super_CScriptBase)._union.indirect_contents.indirect;
          pCVar8 = pCVar13;
          if (uVar1 < 0x1d) {
            pCVar8 = pCVar14;
          }
          uVar15 = (uint32_t)uVar16;
          if ((pCVar8->super_CScriptBase)._union.direct + (int)uVar9 <= local_70.ptr) break;
          uVar1 = pCVar12[uVar16].scriptPubKey.super_CScriptBase._size;
          uVar9 = uVar1 - 0x1d;
          if (uVar1 < 0x1d) {
            uVar9 = uVar1;
          }
          if (uVar1 < 0x1d) {
            pCVar13 = pCVar14;
          }
          bVar4 = GetScriptOp(&local_70,
                              (uchar *)((long)&(pCVar13->super_CScriptBase)._union +
                                       (long)(int)uVar9),&local_8c,&local_88);
          if (bVar4) {
            bVar4 = true;
            vKey_00.m_size =
                 (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            if ((vKey_00.m_size != 0) &&
               (vKey_00.m_data =
                     local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start, bVar5 = contains(this,vKey_00), bVar5
               )) {
              bVar6 = this->nFlags & 3;
              bVar3 = true;
              if (bVar6 == 2) {
                local_a8.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_a8.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_a8.
                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                TVar7 = Solver(pCVar14,&local_a8);
                if ((TVar7 == MULTISIG) || (TVar7 == PUBKEY)) {
                  local_68 = *(undefined1 (*) [8])
                              ((vKey.m_data)->m_wrapped).super_base_blob<256U>.m_data._M_elems;
                  puStack_60 = *(pointer *)
                                ((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
                  local_58 = *(pointer *)
                              ((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
                  auStack_50 = *(uchar (*) [8])
                                ((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
                  local_48 = uVar15;
                  insert(this,(COutPoint *)local_68);
                }
                std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::~vector(&local_a8);
              }
              else if (bVar6 == 1) {
                local_68 = *(undefined1 (*) [8])
                            ((vKey.m_data)->m_wrapped).super_base_blob<256U>.m_data._M_elems;
                puStack_60 = *(pointer *)
                              ((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
                local_58 = *(pointer *)
                            ((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
                auStack_50 = *(uchar (*) [8])
                              ((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
                local_48 = uVar15;
                insert(this,(COutPoint *)local_68);
              }
              goto LAB_0067e224;
            }
          }
          else {
LAB_0067e224:
            bVar4 = false;
          }
        } while (bVar4);
        if ((CScript *)
            local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (CScript *)0x0) {
          operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar16 = (ulong)(uVar15 + 1);
        pCVar12 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar11 = ((long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pCVar12 >> 3) *
                 -0x3333333333333333;
      } while (uVar16 <= uVar11 && uVar11 - uVar16 != 0);
    }
    bVar4 = true;
    if (bVar3 == false) {
      outpoint = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar4 = outpoint != pCVar2;
      if ((bVar4) && (bVar3 = contains(this,&outpoint->prevout), !bVar3)) {
        do {
          local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&outpoint->scriptSig;
          if (0x1c < (outpoint->scriptSig).super_CScriptBase._size) {
            local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)(outpoint->scriptSig).super_CScriptBase._union.indirect_contents.indirect;
          }
          local_68 = (undefined1  [8])0x0;
          puStack_60 = (pointer)0x0;
          local_58 = (pointer)0x0;
          do {
            uVar1 = (outpoint->scriptSig).super_CScriptBase._size;
            uVar9 = uVar1 - 0x1d;
            if (uVar1 < 0x1d) {
              uVar9 = uVar1;
            }
            pCVar14 = (CScript *)
                      (outpoint->scriptSig).super_CScriptBase._union.indirect_contents.indirect;
            if (uVar1 < 0x1d) {
              pCVar14 = &outpoint->scriptSig;
            }
            end.ptr = (uchar *)((long)&(pCVar14->super_CScriptBase)._union + (long)(int)uVar9);
            bVar3 = true;
            if (end.ptr <=
                local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start) goto LAB_0067e35f;
            bVar5 = GetScriptOp((const_iterator *)&local_88,end,(opcodetype *)&local_a8,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
            if (bVar5) {
              vKey_01.m_size = (long)puStack_60 - (long)local_68;
              if ((vKey_01.m_size != 0) &&
                 (vKey_01.m_data = (uchar *)local_68, bVar5 = contains(this,vKey_01), bVar5)) {
                iVar10 = 1;
                goto LAB_0067e34c;
              }
              iVar10 = 0;
              bVar5 = true;
            }
            else {
              iVar10 = 10;
LAB_0067e34c:
              bVar5 = false;
            }
          } while (iVar10 == 0);
          if (iVar10 != 10) {
            bVar3 = bVar5;
          }
LAB_0067e35f:
          if (local_68 != (undefined1  [8])0x0) {
            operator_delete((void *)local_68,(long)local_58 - (long)local_68);
          }
          if (!bVar3) break;
          outpoint = outpoint + 1;
          bVar4 = outpoint != pCVar2;
          if ((outpoint == pCVar2) || (bVar3 = contains(this,&outpoint->prevout), bVar3)) break;
        } while( true );
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool CBloomFilter::IsRelevantAndUpdate(const CTransaction& tx)
{
    bool fFound = false;
    // Match if the filter contains the hash of tx
    //  for finding tx when they appear in a block
    if (vData.empty()) // zero-size = "match-all" filter
        return true;
    const Txid& hash = tx.GetHash();
    if (contains(hash.ToUint256()))
        fFound = true;

    for (unsigned int i = 0; i < tx.vout.size(); i++)
    {
        const CTxOut& txout = tx.vout[i];
        // Match if the filter contains any arbitrary script data element in any scriptPubKey in tx
        // If this matches, also add the specific output that was matched.
        // This means clients don't have to update the filter themselves when a new relevant tx
        // is discovered in order to find spending transactions, which avoids round-tripping and race conditions.
        CScript::const_iterator pc = txout.scriptPubKey.begin();
        std::vector<unsigned char> data;
        while (pc < txout.scriptPubKey.end())
        {
            opcodetype opcode;
            if (!txout.scriptPubKey.GetOp(pc, opcode, data))
                break;
            if (data.size() != 0 && contains(data))
            {
                fFound = true;
                if ((nFlags & BLOOM_UPDATE_MASK) == BLOOM_UPDATE_ALL)
                    insert(COutPoint(hash, i));
                else if ((nFlags & BLOOM_UPDATE_MASK) == BLOOM_UPDATE_P2PUBKEY_ONLY)
                {
                    std::vector<std::vector<unsigned char> > vSolutions;
                    TxoutType type = Solver(txout.scriptPubKey, vSolutions);
                    if (type == TxoutType::PUBKEY || type == TxoutType::MULTISIG) {
                        insert(COutPoint(hash, i));
                    }
                }
                break;
            }
        }
    }

    if (fFound)
        return true;

    for (const CTxIn& txin : tx.vin)
    {
        // Match if the filter contains an outpoint tx spends
        if (contains(txin.prevout))
            return true;

        // Match if the filter contains any arbitrary script data element in any scriptSig in tx
        CScript::const_iterator pc = txin.scriptSig.begin();
        std::vector<unsigned char> data;
        while (pc < txin.scriptSig.end())
        {
            opcodetype opcode;
            if (!txin.scriptSig.GetOp(pc, opcode, data))
                break;
            if (data.size() != 0 && contains(data))
                return true;
        }
    }

    return false;
}